

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<QCss::Declaration>::growAppend
          (QCommonArrayOps<QCss::Declaration> *this,Declaration *b,Declaration *e)

{
  Declaration *pDVar1;
  DeclarationData *pDVar2;
  long lVar3;
  Declaration *pDVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QCss::Declaration> local_48;
  Declaration *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    lVar3 = (long)e - (long)b;
    local_48.d = (Data *)0x0;
    local_48.ptr = (Declaration *)0x0;
    local_48.size = 0;
    pDVar1 = (this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
             super_QArrayDataPointer<QCss::Declaration>.ptr;
    if ((b < pDVar1) ||
       (pDVar1 + (this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
                 super_QArrayDataPointer<QCss::Declaration>.size <= b)) {
      QArrayDataPointer<QCss::Declaration>::detachAndGrow
                ((QArrayDataPointer<QCss::Declaration> *)this,GrowsAtEnd,lVar3 >> 3,
                 (Declaration **)0x0,(QArrayDataPointer<QCss::Declaration> *)0x0);
    }
    else {
      QArrayDataPointer<QCss::Declaration>::detachAndGrow
                ((QArrayDataPointer<QCss::Declaration> *)this,GrowsAtEnd,lVar3 >> 3,&local_28,
                 &local_48);
      b = local_28;
    }
    if (0 < lVar3) {
      pDVar4 = (Declaration *)(lVar3 + (long)b);
      pDVar1 = (this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
               super_QArrayDataPointer<QCss::Declaration>.ptr;
      lVar3 = (this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
              super_QArrayDataPointer<QCss::Declaration>.size;
      do {
        pDVar2 = (b->d).d.ptr;
        pDVar1[lVar3].d.d.ptr = pDVar2;
        if (pDVar2 != (DeclarationData *)0x0) {
          LOCK();
          (pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value = (Type)((int)(pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                                 super_QBasicAtomicInteger<int>._q_value + 1);
          UNLOCK();
          lVar3 = (this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
                  super_QArrayDataPointer<QCss::Declaration>.size;
        }
        b = b + 1;
        lVar3 = lVar3 + 1;
        (this->super_Type).super_QGenericArrayOps<QCss::Declaration>.
        super_QArrayDataPointer<QCss::Declaration>.size = lVar3;
      } while (b < pDVar4);
    }
    QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }